

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

bool __thiscall
Editor::textCommandEntered
          (Editor *this,string *input,int *currentLineNumber,LinkedList *list,bool *isInsert)

{
  command cVar1;
  bool bVar2;
  Editor *pEVar3;
  int n;
  int m;
  string cmd;
  istringstream ss;
  
  pEVar3 = (Editor *)&ss;
  std::__cxx11::istringstream::istringstream((istringstream *)pEVar3,(string *)input,_S_in);
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  cmd._M_string_length = 0;
  n = 0;
  cmd.field_2._M_local_buf[0] = '\0';
  m = 0;
  cVar1 = checkCommand(pEVar3,input);
  switch(cVar1) {
  case cmdL:
    bVar2 = true;
    cmdList(pEVar3,list);
    break;
  case cmdLn:
    std::operator>>((istream *)&ss,(string *)&cmd);
    pEVar3 = (Editor *)&ss;
    std::istream::operator>>((istream *)pEVar3,&n);
    bVar2 = true;
    cmdList(pEVar3,n,list);
    break;
  case cmdLnm:
    std::operator>>((istream *)&ss,(string *)&cmd);
    std::istream::operator>>((istream *)&ss,&n);
    pEVar3 = (Editor *)&ss;
    std::istream::operator>>((istream *)pEVar3,&m);
    bVar2 = true;
    cmdList(pEVar3,n,m,list);
    break;
  case cmdD:
    bVar2 = true;
    cmdDelete(pEVar3,currentLineNumber,list);
    break;
  case cmdDn:
    std::operator>>((istream *)&ss,(string *)&cmd);
    pEVar3 = (Editor *)&ss;
    std::istream::operator>>((istream *)pEVar3,&n);
    bVar2 = true;
    cmdDelete(pEVar3,n,currentLineNumber,list);
    break;
  case cmdDnm:
    std::operator>>((istream *)&ss,(string *)&cmd);
    std::istream::operator>>((istream *)&ss,&n);
    pEVar3 = (Editor *)&ss;
    std::istream::operator>>((istream *)pEVar3,&m);
    bVar2 = true;
    cmdDelete(pEVar3,n,m,currentLineNumber,list);
    break;
  case cmdI:
    bVar2 = true;
    cmdInsert(pEVar3,currentLineNumber,list,isInsert);
    break;
  case cmdIn:
    std::operator>>((istream *)&ss,(string *)&cmd);
    pEVar3 = (Editor *)&ss;
    std::istream::operator>>((istream *)pEVar3,&n);
    bVar2 = true;
    cmdInsert(pEVar3,n,currentLineNumber,list,isInsert);
    break;
  default:
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&cmd);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return bVar2;
}

Assistant:

bool Editor::textCommandEntered(const std::string &input, int *currentLineNumber, LinkedList *list, bool *isInsert) {

    // Define string stream and variables to parse the command into it's letter and int value(s).
    // Adapted from: https://www.geeksforgeeks.org/split-a-sentence-into-words-in-cpp/
    std::istringstream ss(input);
    std::string cmd;
    int n = 0;
    int m = 0;

    // Check if the input is a command, parse the command, call the corresponding function.
    switch (checkCommand(input)) {
        case cmdL:

            // Call the List command
            cmdList(list);

            return true;

        case cmdLn:

            // Retrieve the command and the number(s) from the string stream
            ss >> cmd;
            ss >> n;

            // Call the corresponding function
            cmdList(n, list);

            return true;

        case cmdLnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdList(n, m, list);
            return true;
        case cmdD:
            cmdDelete(currentLineNumber, list);
            return true;
        case cmdDn:
            ss >> cmd;
            ss >> n;
            cmdDelete(n, currentLineNumber, list);
            return true;
        case cmdDnm:
            ss >> cmd;
            ss >> n;
            ss >> m;
            cmdDelete(n, m, currentLineNumber, list);
            return true;
        case cmdI:
            cmdInsert(currentLineNumber, list, isInsert);
            return true;
        case cmdIn:
            ss >> cmd;
            ss >> n;
            cmdInsert(n, currentLineNumber, list, isInsert);
            return true;
        default:
            return false; // Input is not a valid command
    }
}